

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O0

string * __thiscall
spirv_cross::
join<char_const(&)[27],spirv_cross::TypedID<(spirv_cross::Types)0>const&,char_const(&)[9],std::__cxx11::string,char_const(&)[17],unsigned_int&,char_const(&)[9],std::__cxx11::string,char_const(&)[54]>
          (string *__return_storage_ptr__,spirv_cross *this,char (*ts) [27],
          TypedID<(spirv_cross::Types)0> *ts_1,char (*ts_2) [9],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_3,char (*ts_4) [17],
          uint *ts_5,char (*ts_6) [9],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_7,char (*ts_8) [54])

{
  undefined1 local_1138 [8];
  StringStream<4096UL,_4096UL> stream;
  char (*ts_local_4) [17];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_local_3;
  char (*ts_local_2) [9];
  TypedID<(spirv_cross::Types)0> *ts_local_1;
  char (*ts_local) [27];
  
  stream.saved_buffers.stack_storage.aligned_char._184_8_ = ts_3;
  StringStream<4096UL,_4096UL>::StringStream((StringStream<4096UL,_4096UL> *)local_1138);
  inner::
  join_helper<char_const(&)[27],spirv_cross::TypedID<(spirv_cross::Types)0>const&,char_const(&)[9],std::__cxx11::string,char_const(&)[17],unsigned_int&,char_const(&)[9],std::__cxx11::string,char_const(&)[54]>
            ((StringStream<4096UL,_4096UL> *)local_1138,(char (*) [27])this,
             (TypedID<(spirv_cross::Types)0> *)ts,(char (*) [9])ts_1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ts_2,
             (char (*) [17])stream.saved_buffers.stack_storage.aligned_char._184_8_,(uint *)ts_4,
             (char (*) [9])ts_5,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ts_6,
             (char (*) [54])ts_7);
  StringStream<4096ul,4096ul>::str_abi_cxx11_
            (__return_storage_ptr__,(StringStream<4096ul,4096ul> *)local_1138);
  StringStream<4096UL,_4096UL>::~StringStream((StringStream<4096UL,_4096UL> *)local_1138);
  return __return_storage_ptr__;
}

Assistant:

std::string join(Ts &&... ts)
{
	StringStream<> stream;
	inner::join_helper(stream, std::forward<Ts>(ts)...);
	return stream.str();
}